

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O3

int PAL_iswlower(char16_t c)

{
  BOOL BVar1;
  uint uVar2;
  undefined8 in_RAX;
  UnicodeDataRec local_18;
  UnicodeDataRec dataRec;
  
  local_18.C1_TYPE_FLAGS = (WORD)((ulong)in_RAX >> 0x10);
  if (PAL_InitializeChakraCoreCalled) {
    BVar1 = GetUnicodeData((uint)(ushort)c,&local_18);
    if (BVar1 == 0) {
      uVar2 = 0;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011e757;
    }
    else {
      uVar2 = local_18.C1_TYPE_FLAGS >> 1 & 1;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      return uVar2;
    }
  }
LAB_0011e757:
  abort();
}

Assistant:

int
__cdecl
PAL_iswlower( char16_t c )
{
    BOOL bRetVal = FALSE;
#if HAVE_COREFOUNDATION
    static CFCharacterSetRef sLowercaseSet;

    if (sLowercaseSet == NULL)
    {
        sLowercaseSet = CFCharacterSetGetPredefined(
                                        kCFCharacterSetLowercaseLetter);
    }
    PERF_ENTRY(iswlower);
    ENTRY("PAL_iswlower (c=%d)\n", c);
    bRetVal = CFCharacterSetIsCharacterMember(sLowercaseSet, c);
#else   /* HAVE_COREFOUNDATION */
    UnicodeDataRec dataRec;

    PERF_ENTRY(iswlower);
    ENTRY("PAL_iswlower (c=%d)\n", c);

    if (!GetUnicodeData(c, &dataRec))
    {
        TRACE( "Unable to retrieve unicode data for the character %c.\n", c );
        goto exit;
    }

    if (dataRec.C1_TYPE_FLAGS & C1_LOWER)
    {
        bRetVal = TRUE;
    }
exit:
#endif  /* HAVE_COREFOUNDATION */
    LOGEXIT("PAL_iswlower returns %s.\n", bRetVal == TRUE ? "TRUE" : "FALSE");
    PERF_EXIT(iswlower);
    return bRetVal;
}